

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::PostProcessRootAnimations(ColladaParser *this)

{
  pointer pcVar1;
  ColladaParser *pCVar2;
  iterator iVar3;
  pointer pbVar4;
  pointer ppVar5;
  Animation *clip;
  string clipName;
  Animation temp;
  string animationID;
  Animation *local_d0;
  ColladaParser *local_c8;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined1 local_a0 [56];
  vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_> vStack_68;
  key_type local_50;
  
  ppVar5 = (this->mAnimationClipLibrary).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->mAnimationClipLibrary).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar5) {
    local_a0._0_8_ = local_a0 + 0x10;
    local_a0._8_8_ = 0;
    local_a0[0x10] = '\0';
    local_a0._32_8_ = (pointer)0x0;
    local_a0._40_8_ = (pointer)0x0;
    local_a0._48_8_ = (pointer)0x0;
    vStack_68.
    super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (Animation **)0x0;
    vStack_68.
    super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (Animation **)0x0;
    vStack_68.
    super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (Animation **)0x0;
    local_c8 = this;
    do {
      local_c0[0] = local_b0;
      pcVar1 = (ppVar5->first)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_c0,pcVar1,pcVar1 + (ppVar5->first)._M_string_length);
      local_d0 = (Animation *)operator_new(0x50);
      (local_d0->mName).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(local_d0->mName).field_2 + 8) = 0;
      (local_d0->mName)._M_dataplus._M_p = (pointer)&(local_d0->mName).field_2;
      (local_d0->mName)._M_string_length = 0;
      (local_d0->mChannels).
      super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_d0->mChannels).
      super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_d0->mChannels).
      super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_d0->mSubAnims).
      super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_d0->mSubAnims).
      super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_d0->mSubAnims).
      super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::_M_assign((string *)local_d0);
      if (vStack_68.
          super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          vStack_68.
          super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Assimp::Collada::Animation*,std::allocator<Assimp::Collada::Animation*>>::
        _M_realloc_insert<Assimp::Collada::Animation*const&>
                  ((vector<Assimp::Collada::Animation*,std::allocator<Assimp::Collada::Animation*>>
                    *)&vStack_68,
                   (iterator)
                   vStack_68.
                   super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_d0);
      }
      else {
        *vStack_68.
         super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = local_d0;
        vStack_68.
        super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             vStack_68.
             super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      for (pbVar4 = (ppVar5->second).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar4 != (ppVar5->second).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
        pcVar1 = (pbVar4->_M_dataplus)._M_p;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar1,pcVar1 + pbVar4->_M_string_length);
        iVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Animation_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Animation_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Animation_*>_>_>
                ::find(&(this->mAnimationLibrary)._M_t,&local_50);
        if ((_Rb_tree_header *)iVar3._M_node !=
            &(this->mAnimationLibrary)._M_t._M_impl.super__Rb_tree_header) {
          Collada::Animation::CollectChannelsRecursively
                    (*(Animation **)(iVar3._M_node + 2),&local_d0->mChannels);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      if (local_c0[0] != local_b0) {
        operator_delete(local_c0[0]);
      }
      pCVar2 = local_c8;
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != (local_c8->mAnimationClipLibrary).
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::_M_assign((string *)&local_c8->mAnims);
    std::
    vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>::
    operator=(&(pCVar2->mAnims).mChannels,
              (vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
               *)(local_a0 + 0x20));
    std::vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>::
    operator=(&(pCVar2->mAnims).mSubAnims,&vStack_68);
    if (vStack_68.
        super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        vStack_68.
        super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      vStack_68.
      super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           vStack_68.
           super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
    Collada::Animation::~Animation((Animation *)local_a0);
    return;
  }
  Collada::Animation::CombineSingleChannelAnimationsRecursively(&this->mAnims,&this->mAnims);
  return;
}

Assistant:

void ColladaParser::PostProcessRootAnimations()
{
    if (mAnimationClipLibrary.size() > 0)
    {
        Animation temp;

        for (AnimationClipLibrary::iterator it = mAnimationClipLibrary.begin(); it != mAnimationClipLibrary.end(); ++it)
        {
            std::string clipName = it->first;

            Animation *clip = new Animation();
            clip->mName = clipName;

            temp.mSubAnims.push_back(clip);

            for (std::vector<std::string>::iterator a = it->second.begin(); a != it->second.end(); ++a)
            {
                std::string animationID = *a;

                AnimationLibrary::iterator animation = mAnimationLibrary.find(animationID);

                if (animation != mAnimationLibrary.end())
                {
                    Animation *pSourceAnimation = animation->second;

                    pSourceAnimation->CollectChannelsRecursively(clip->mChannels);
                }
            }
        }

        mAnims = temp;

        // Ensure no double deletes.
        temp.mSubAnims.clear();
    }
    else
    {
        mAnims.CombineSingleChannelAnimations();
    }
}